

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_writer.cc
# Opt level: O1

void __thiscall
NanomsgWriter::NanomsgWriter
          (NanomsgWriter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *endpoints)

{
  pointer pbVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  pointer pbVar7;
  int size;
  stringstream ss;
  string local_1d0 [36];
  undefined4 local_1ac;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  PacketWriter::PacketWriter(&this->super_PacketWriter);
  (this->super_PacketWriter)._vptr_PacketWriter = (_func_int **)&PTR__NanomsgWriter_0014a5c8;
  iVar2 = nn_socket(1,0x20);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_socket: ",0xb);
    iVar2 = nn_errno();
    pcVar4 = nn_strerror(iVar2);
    std::operator<<(local_198,pcVar4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1d0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar7 = (endpoints->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (endpoints->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pbVar7 == pbVar1) {
      local_1ac = 0x100000;
      iVar3 = nn_setsockopt(this->fd_,0,2,&local_1ac,4);
      if (-1 < iVar3) {
        this->fd_ = iVar2;
        return;
      }
      nn_close(this->fd_);
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_setsockopt: ",0xf);
      iVar2 = nn_errno();
      pcVar4 = nn_strerror(iVar2);
      std::operator<<(local_198,pcVar4);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,local_1d0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = nn_bind(iVar2,(pbVar7->_M_dataplus)._M_p);
    if (iVar3 < 0) break;
    pbVar7 = pbVar7 + 1;
  }
  nn_close(iVar2);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_bind: ",9);
  iVar2 = nn_errno();
  pcVar4 = nn_strerror(iVar2);
  std::operator<<(local_198,pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," (",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,local_1d0);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NanomsgWriter::NanomsgWriter(const std::vector<std::string>& endpoints) {
  auto fd = nn_socket(AF_SP, NN_PUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  for (const auto& endpoint : endpoints) {
    auto rv = nn_bind(fd, endpoint.c_str());
    if (rv < 0) {
      nn_close(fd);
      std::stringstream ss;
      ss << "nn_bind: " << nn_strerror(nn_errno());
      ss << " (" << endpoint << ")";
      throw std::runtime_error(ss.str());
    }
  }

  int size = 1048576;
  auto rv = nn_setsockopt(fd_, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
  if (rv < 0) {
    nn_close(fd_);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  fd_ = fd;
}